

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

bool __thiscall cmCTest::SetArgsFromPreset(cmCTest *this,string *presetName,bool listPresets)

{
  VerbosityEnum VVar1;
  TruncationMode TVar2;
  int iVar3;
  ModeEnum MVar4;
  NoTestsActionEnum NVar5;
  bool bVar6;
  pointer ppVar7;
  TestPreset *pTVar8;
  pointer ppVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  ulong uVar10;
  ConfigurePreset *pCVar11;
  OutputOptions *pOVar12;
  TruncationMode *pTVar13;
  FilterOptions *pFVar14;
  IncludeOptions *pIVar15;
  IndexOptions *pIVar16;
  IndexOptions *pIVar17;
  IndexOptions *pIVar18;
  cmCTestTestHandler *this_00;
  cmCTestMemCheckHandler *this_01;
  ExcludeOptions *pEVar19;
  FixturesOptions *pFVar20;
  ExecutionOptions *pEVar21;
  pointer pPVar22;
  ShowOnlyEnum *pSVar23;
  RepeatOptions *pRVar24;
  bool *pbVar25;
  int *piVar26;
  NoTestsActionEnum *pNVar27;
  rep_conflict local_b40;
  bool local_b31;
  int local_b30;
  allocator<char> local_b29;
  int testLoad;
  int local_b08;
  bool local_b03;
  bool local_b02;
  allocator<char> local_b01;
  int jobs;
  allocator<char> local_ad9;
  string local_ad8;
  allocator<char> local_ab1;
  string local_ab0;
  allocator<char> local_a89;
  string local_a88;
  allocator<char> local_a61;
  string local_a60;
  allocator<char> local_a39;
  string local_a38;
  allocator<char> local_a11;
  string local_a10;
  bool local_9ea;
  allocator<char> local_9e9;
  string local_9e8;
  allocator<char> local_9c1;
  string local_9c0;
  string_view local_9a0;
  string local_990;
  byte local_96a;
  allocator<char> local_969;
  string local_968;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_948;
  byte local_922;
  allocator<char> local_921;
  string local_920;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_900;
  byte local_8da;
  allocator<char> local_8d9;
  string local_8d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8b8;
  undefined1 local_898 [8];
  string indexOptions;
  optional<int> *stride;
  optional<int> *end;
  optional<int> *start;
  string local_858;
  allocator<char> local_831;
  string local_830;
  bool local_80e;
  bool local_80d;
  bool local_80c;
  bool local_80b;
  bool local_80a;
  bool local_809;
  VerbosityEnum *local_808;
  VerbosityEnum *verbosity;
  reference local_7f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *kvp;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_1;
  cmAlphaNum local_7a8;
  string local_778;
  cmAlphaNum local_758;
  cmAlphaNum local_728;
  string local_6f8;
  reference local_6d8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *var;
  iterator __end1;
  iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *__range1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  presetEnvironment;
  cmAlphaNum local_658;
  string local_628;
  optional<cmCMakePresetsGraph::ConfigurePreset> *local_608;
  optional<cmCMakePresetsGraph::ConfigurePreset> *expandedConfigurePreset;
  cmAlphaNum local_5f8;
  cmAlphaNum local_5c8;
  string local_598;
  char local_571;
  cmAlphaNum local_570;
  cmAlphaNum local_540;
  string local_510;
  _Self local_4f0;
  _Self local_4e8;
  iterator configurePresetPair;
  cmAlphaNum local_4d8;
  cmAlphaNum local_4a8;
  string local_478;
  cmAlphaNum local_458;
  cmAlphaNum local_428;
  string local_3f8;
  optional<cmCMakePresetsGraph::TestPreset> *local_3d8;
  optional<cmCMakePresetsGraph::TestPreset> *expandedPreset;
  cmAlphaNum local_3c8;
  cmAlphaNum local_398;
  string local_368;
  char local_341;
  cmAlphaNum local_340;
  cmAlphaNum local_310;
  string local_2e0;
  _Self local_2c0;
  _Self local_2b8;
  iterator presetPair;
  char *local_2a8;
  cmAlphaNum local_2a0;
  cmAlphaNum local_270;
  string local_240;
  ReadFileResult local_20c;
  undefined1 local_208 [4];
  ReadFileResult result;
  cmCMakePresetsGraph settingsFile;
  string workingDirectory;
  bool listPresets_local;
  string *presetName_local;
  cmCTest *this_local;
  
  cmSystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
  cmCMakePresetsGraph::cmCMakePresetsGraph((cmCMakePresetsGraph *)local_208);
  local_20c = cmCMakePresetsGraph::ReadProjectPresets
                        ((cmCMakePresetsGraph *)local_208,
                         (string *)
                         &settingsFile.Files.
                          super__Vector_base<std::unique_ptr<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,false);
  if (local_20c != READ_OK) {
    cmAlphaNum::cmAlphaNum(&local_270,"Could not read presets from ");
    cmAlphaNum::cmAlphaNum
              (&local_2a0,
               (string *)
               &settingsFile.Files.
                super__Vector_base<std::unique_ptr<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_2a8 = cmCMakePresetsGraph::ResultToString(local_20c);
    cmStrCat<char[3],char_const*>
              (&local_240,&local_270,&local_2a0,(char (*) [3])0xdcec16,&local_2a8);
    cmSystemTools::Error(&local_240);
    std::__cxx11::string::~string((string *)&local_240);
    this_local._7_1_ = false;
    presetPair._M_node._4_4_ = 1;
    goto LAB_0096f96a;
  }
  if (listPresets) {
    cmCMakePresetsGraph::PrintTestPresetList
              ((cmCMakePresetsGraph *)local_208,(PrintPrecedingNewline *)0x0);
    this_local._7_1_ = true;
    presetPair._M_node._4_4_ = 1;
    goto LAB_0096f96a;
  }
  local_2b8._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>_>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>_>_>_>
               *)&settingsFile.BuildPresets._M_t._M_impl.super__Rb_tree_header._M_node_count,
              presetName);
  local_2c0._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>_>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>_>_>_>
              *)&settingsFile.BuildPresets._M_t._M_impl.super__Rb_tree_header._M_node_count);
  bVar6 = std::operator==(&local_2b8,&local_2c0);
  if (bVar6) {
    cmAlphaNum::cmAlphaNum(&local_310,"No such test preset in ");
    cmAlphaNum::cmAlphaNum
              (&local_340,
               (string *)
               &settingsFile.Files.
                super__Vector_base<std::unique_ptr<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_341 = '\"';
    cmStrCat<char[4],std::__cxx11::string,char>
              (&local_2e0,&local_310,&local_340,(char (*) [4])0xde4f0e,presetName,&local_341);
    cmSystemTools::Error(&local_2e0);
    std::__cxx11::string::~string((string *)&local_2e0);
    cmCMakePresetsGraph::PrintTestPresetList
              ((cmCMakePresetsGraph *)local_208,(PrintPrecedingNewline *)0x0);
    this_local._7_1_ = false;
    presetPair._M_node._4_4_ = 1;
    goto LAB_0096f96a;
  }
  ppVar7 = std::
           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>_>_>
           ::operator->(&local_2b8);
  if (((ppVar7->second).Unexpanded.super_Preset.Hidden & 1U) != 0) {
    cmAlphaNum::cmAlphaNum(&local_398,"Cannot use hidden test preset in ");
    cmAlphaNum::cmAlphaNum
              (&local_3c8,
               (string *)
               &settingsFile.Files.
                super__Vector_base<std::unique_ptr<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    expandedPreset._7_1_ = 0x22;
    cmStrCat<char[4],std::__cxx11::string,char>
              (&local_368,&local_398,&local_3c8,(char (*) [4])0xde4f0e,presetName,
               (char *)((long)&expandedPreset + 7));
    cmSystemTools::Error(&local_368);
    std::__cxx11::string::~string((string *)&local_368);
    cmCMakePresetsGraph::PrintTestPresetList
              ((cmCMakePresetsGraph *)local_208,(PrintPrecedingNewline *)0x0);
    this_local._7_1_ = false;
    presetPair._M_node._4_4_ = 1;
    goto LAB_0096f96a;
  }
  ppVar7 = std::
           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>_>_>
           ::operator->(&local_2b8);
  local_3d8 = &(ppVar7->second).Expanded;
  bVar6 = std::optional::operator_cast_to_bool((optional *)local_3d8);
  if (!bVar6) {
    cmAlphaNum::cmAlphaNum(&local_428,"Could not evaluate test preset \"");
    cmAlphaNum::cmAlphaNum(&local_458,presetName);
    cmStrCat<char[27]>(&local_3f8,&local_428,&local_458,(char (*) [27])"\": Invalid macro expansion"
                      );
    cmSystemTools::Error(&local_3f8);
    std::__cxx11::string::~string((string *)&local_3f8);
    cmCMakePresetsGraph::PrintTestPresetList
              ((cmCMakePresetsGraph *)local_208,(PrintPrecedingNewline *)0x0);
    this_local._7_1_ = false;
    presetPair._M_node._4_4_ = 1;
    goto LAB_0096f96a;
  }
  pTVar8 = std::optional<cmCMakePresetsGraph::TestPreset>::operator->(local_3d8);
  if (((pTVar8->super_Preset).ConditionResult & 1U) == 0) {
    cmAlphaNum::cmAlphaNum(&local_4a8,"Cannot use disabled test preset in ");
    cmAlphaNum::cmAlphaNum
              (&local_4d8,
               (string *)
               &settingsFile.Files.
                super__Vector_base<std::unique_ptr<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    configurePresetPair._M_node._7_1_ = 0x22;
    cmStrCat<char[4],std::__cxx11::string,char>
              (&local_478,&local_4a8,&local_4d8,(char (*) [4])0xde4f0e,presetName,
               (char *)((long)&configurePresetPair._M_node + 7));
    cmSystemTools::Error(&local_478);
    std::__cxx11::string::~string((string *)&local_478);
    cmCMakePresetsGraph::PrintTestPresetList
              ((cmCMakePresetsGraph *)local_208,(PrintPrecedingNewline *)0x0);
    this_local._7_1_ = false;
    presetPair._M_node._4_4_ = 1;
    goto LAB_0096f96a;
  }
  pTVar8 = std::optional<cmCMakePresetsGraph::TestPreset>::operator->(local_3d8);
  local_4e8._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>_>
               *)((long)&settingsFile.errors.field_2 + 8),&pTVar8->ConfigurePreset);
  local_4f0._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>_>
              *)((long)&settingsFile.errors.field_2 + 8));
  bVar6 = std::operator==(&local_4e8,&local_4f0);
  if (bVar6) {
    cmAlphaNum::cmAlphaNum(&local_540,"No such configure preset in ");
    cmAlphaNum::cmAlphaNum
              (&local_570,
               (string *)
               &settingsFile.Files.
                super__Vector_base<std::unique_ptr<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    pTVar8 = std::optional<cmCMakePresetsGraph::TestPreset>::operator->(local_3d8);
    local_571 = '\"';
    cmStrCat<char[4],std::__cxx11::string,char>
              (&local_510,&local_540,&local_570,(char (*) [4])0xde4f0e,&pTVar8->ConfigurePreset,
               &local_571);
    cmSystemTools::Error(&local_510);
    std::__cxx11::string::~string((string *)&local_510);
    cmCMakePresetsGraph::PrintConfigurePresetList
              ((cmCMakePresetsGraph *)local_208,(PrintPrecedingNewline *)0x0);
    this_local._7_1_ = false;
    presetPair._M_node._4_4_ = 1;
    goto LAB_0096f96a;
  }
  ppVar9 = std::
           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>
           ::operator->(&local_4e8);
  if (((ppVar9->second).Unexpanded.super_Preset.Hidden & 1U) != 0) {
    cmAlphaNum::cmAlphaNum(&local_5c8,"Cannot use hidden configure preset in ");
    cmAlphaNum::cmAlphaNum
              (&local_5f8,
               (string *)
               &settingsFile.Files.
                super__Vector_base<std::unique_ptr<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    pTVar8 = std::optional<cmCMakePresetsGraph::TestPreset>::operator->(local_3d8);
    expandedConfigurePreset._7_1_ = 0x22;
    cmStrCat<char[4],std::__cxx11::string,char>
              (&local_598,&local_5c8,&local_5f8,(char (*) [4])0xde4f0e,&pTVar8->ConfigurePreset,
               (char *)((long)&expandedConfigurePreset + 7));
    cmSystemTools::Error(&local_598);
    std::__cxx11::string::~string((string *)&local_598);
    cmCMakePresetsGraph::PrintConfigurePresetList
              ((cmCMakePresetsGraph *)local_208,(PrintPrecedingNewline *)0x0);
    this_local._7_1_ = false;
    presetPair._M_node._4_4_ = 1;
    goto LAB_0096f96a;
  }
  ppVar9 = std::
           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>
           ::operator->(&local_4e8);
  local_608 = &(ppVar9->second).Expanded;
  bVar6 = std::optional::operator_cast_to_bool((optional *)local_608);
  if (!bVar6) {
    cmAlphaNum::cmAlphaNum(&local_658,"Could not evaluate configure preset \"");
    pTVar8 = std::optional<cmCMakePresetsGraph::TestPreset>::operator->(local_3d8);
    cmAlphaNum::cmAlphaNum
              ((cmAlphaNum *)&presetEnvironment._M_t._M_impl.super__Rb_tree_header._M_node_count,
               &pTVar8->ConfigurePreset);
    cmStrCat<char[27]>(&local_628,&local_658,
                       (cmAlphaNum *)
                       &presetEnvironment._M_t._M_impl.super__Rb_tree_header._M_node_count,
                       (char (*) [27])"\": Invalid macro expansion");
    cmSystemTools::Error(&local_628);
    std::__cxx11::string::~string((string *)&local_628);
    this_local._7_1_ = false;
    presetPair._M_node._4_4_ = 1;
    goto LAB_0096f96a;
  }
  pTVar8 = std::optional<cmCMakePresetsGraph::TestPreset>::operator->(local_3d8);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         *)&__range1,&(pTVar8->super_Preset).Environment);
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    *)&__range1);
  var = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  *)&__range1);
  while (bVar6 = std::operator!=(&__end1,(_Self *)&var), bVar6) {
    local_6d8 = std::
                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&__end1);
    bVar6 = std::optional::operator_cast_to_bool((optional *)&local_6d8->second);
    if (bVar6) {
      cmAlphaNum::cmAlphaNum(&local_728,&local_6d8->first);
      cmAlphaNum::cmAlphaNum(&local_758,'=');
      args = std::
             optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_6d8->second);
      cmStrCat<std::__cxx11::string>(&local_6f8,&local_728,&local_758,args);
      cmsys::SystemTools::PutEnv(&local_6f8);
      std::__cxx11::string::~string((string *)&local_6f8);
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  std::optional<cmCMakePresetsGraph::TestPreset>::operator->(local_3d8);
  uVar10 = std::__cxx11::string::empty();
  if ((uVar10 & 1) == 0) {
    pTVar8 = std::optional<cmCMakePresetsGraph::TestPreset>::operator->(local_3d8);
    SetConfigType(this,&pTVar8->Configuration);
  }
  cmAlphaNum::cmAlphaNum(&local_7a8,"BuildDirectory=");
  pCVar11 = std::optional<cmCMakePresetsGraph::ConfigurePreset>::operator->(local_608);
  cmAlphaNum::cmAlphaNum((cmAlphaNum *)&__range1_1,&pCVar11->BinaryDir);
  cmStrCat<>(&local_778,&local_7a8,(cmAlphaNum *)&__range1_1);
  AddCTestConfigurationOverwrite(this,&local_778);
  std::__cxx11::string::~string((string *)&local_778);
  pTVar8 = std::optional<cmCMakePresetsGraph::TestPreset>::operator->(local_3d8);
  __end1_1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&pTVar8->OverwriteConfigurationFile);
  kvp = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end(&pTVar8->OverwriteConfigurationFile);
  while (bVar6 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&kvp), bVar6) {
    local_7f8 = __gnu_cxx::
                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&__end1_1);
    AddCTestConfigurationOverwrite(this,local_7f8);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1_1);
  }
  pTVar8 = std::optional<cmCMakePresetsGraph::TestPreset>::operator->(local_3d8);
  bVar6 = std::optional::operator_cast_to_bool((optional *)&pTVar8->Output);
  if (bVar6) {
    pTVar8 = std::optional<cmCMakePresetsGraph::TestPreset>::operator->(local_3d8);
    pOVar12 = std::optional<cmCMakePresetsGraph::TestPreset::OutputOptions>::operator->
                        (&pTVar8->Output);
    verbosity._7_1_ = 0;
    bVar6 = std::optional<bool>::value_or<bool>
                      (&pOVar12->ShortProgress,(bool *)((long)&verbosity + 7));
    pPVar22 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                        (&this->Impl);
    pPVar22->TestProgressOutput = bVar6;
    pTVar8 = std::optional<cmCMakePresetsGraph::TestPreset>::operator->(local_3d8);
    pOVar12 = std::optional<cmCMakePresetsGraph::TestPreset::OutputOptions>::operator->
                        (&pTVar8->Output);
    bVar6 = std::optional::operator_cast_to_bool((optional *)&pOVar12->Verbosity);
    if (bVar6) {
      pTVar8 = std::optional<cmCMakePresetsGraph::TestPreset>::operator->(local_3d8);
      pOVar12 = std::optional<cmCMakePresetsGraph::TestPreset::OutputOptions>::operator->
                          (&pTVar8->Output);
      local_808 = std::optional<cmCMakePresetsGraph::TestPreset::OutputOptions::VerbosityEnum>::
                  operator*(&pOVar12->Verbosity);
      VVar1 = *local_808;
      if (VVar1 != Default) {
        if (VVar1 != Verbose) {
          if (VVar1 != Extra) goto LAB_0096de0b;
          pPVar22 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                    operator->(&this->Impl);
          pPVar22->ExtraVerbose = true;
        }
        pPVar22 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                  operator->(&this->Impl);
        pPVar22->Verbose = true;
      }
    }
LAB_0096de0b:
    pTVar8 = std::optional<cmCMakePresetsGraph::TestPreset>::operator->(local_3d8);
    pOVar12 = std::optional<cmCMakePresetsGraph::TestPreset::OutputOptions>::operator->
                        (&pTVar8->Output);
    local_809 = false;
    bVar6 = std::optional<bool>::value_or<bool>(&pOVar12->Debug,&local_809);
    pPVar22 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                        (&this->Impl);
    pPVar22->Debug = bVar6;
    pTVar8 = std::optional<cmCMakePresetsGraph::TestPreset>::operator->(local_3d8);
    pOVar12 = std::optional<cmCMakePresetsGraph::TestPreset::OutputOptions>::operator->
                        (&pTVar8->Output);
    local_80a = false;
    bVar6 = std::optional<bool>::value_or<bool>(&pOVar12->Debug,&local_80a);
    pPVar22 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                        (&this->Impl);
    pPVar22->ShowLineNumbers = bVar6;
    pTVar8 = std::optional<cmCMakePresetsGraph::TestPreset>::operator->(local_3d8);
    pOVar12 = std::optional<cmCMakePresetsGraph::TestPreset::OutputOptions>::operator->
                        (&pTVar8->Output);
    local_80b = false;
    bVar6 = std::optional<bool>::value_or<bool>(&pOVar12->OutputOnFailure,&local_80b);
    pPVar22 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                        (&this->Impl);
    pPVar22->OutputTestOutputOnTestFailure = bVar6;
    pTVar8 = std::optional<cmCMakePresetsGraph::TestPreset>::operator->(local_3d8);
    pOVar12 = std::optional<cmCMakePresetsGraph::TestPreset::OutputOptions>::operator->
                        (&pTVar8->Output);
    local_80c = false;
    bVar6 = std::optional<bool>::value_or<bool>(&pOVar12->Quiet,&local_80c);
    pPVar22 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                        (&this->Impl);
    pPVar22->Quiet = bVar6;
    pTVar8 = std::optional<cmCMakePresetsGraph::TestPreset>::operator->(local_3d8);
    std::optional<cmCMakePresetsGraph::TestPreset::OutputOptions>::operator->(&pTVar8->Output);
    uVar10 = std::__cxx11::string::empty();
    if ((uVar10 & 1) == 0) {
      pTVar8 = std::optional<cmCMakePresetsGraph::TestPreset>::operator->(local_3d8);
      pOVar12 = std::optional<cmCMakePresetsGraph::TestPreset::OutputOptions>::operator->
                          (&pTVar8->Output);
      SetOutputLogFileName(this,&pOVar12->OutputLogFile);
    }
    pTVar8 = std::optional<cmCMakePresetsGraph::TestPreset>::operator->(local_3d8);
    std::optional<cmCMakePresetsGraph::TestPreset::OutputOptions>::operator->(&pTVar8->Output);
    uVar10 = std::__cxx11::string::empty();
    if ((uVar10 & 1) == 0) {
      pTVar8 = std::optional<cmCMakePresetsGraph::TestPreset>::operator->(local_3d8);
      pOVar12 = std::optional<cmCMakePresetsGraph::TestPreset::OutputOptions>::operator->
                          (&pTVar8->Output);
      SetOutputJUnitFileName(this,&pOVar12->OutputJUnitFile);
    }
    pTVar8 = std::optional<cmCMakePresetsGraph::TestPreset>::operator->(local_3d8);
    pOVar12 = std::optional<cmCMakePresetsGraph::TestPreset::OutputOptions>::operator->
                        (&pTVar8->Output);
    local_80d = true;
    bVar6 = std::optional<bool>::value_or<bool>(&pOVar12->LabelSummary,&local_80d);
    pPVar22 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                        (&this->Impl);
    pPVar22->LabelSummary = bVar6;
    pTVar8 = std::optional<cmCMakePresetsGraph::TestPreset>::operator->(local_3d8);
    pOVar12 = std::optional<cmCMakePresetsGraph::TestPreset::OutputOptions>::operator->
                        (&pTVar8->Output);
    local_80e = true;
    bVar6 = std::optional<bool>::value_or<bool>(&pOVar12->SubprojectSummary,&local_80e);
    pPVar22 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                        (&this->Impl);
    pPVar22->SubprojectSummary = bVar6;
    pTVar8 = std::optional<cmCMakePresetsGraph::TestPreset>::operator->(local_3d8);
    pOVar12 = std::optional<cmCMakePresetsGraph::TestPreset::OutputOptions>::operator->
                        (&pTVar8->Output);
    bVar6 = std::optional::operator_cast_to_bool((optional *)&pOVar12->MaxPassedTestOutputSize);
    if (bVar6) {
      pPVar22 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                operator->(&this->Impl);
      pTVar8 = std::optional<cmCMakePresetsGraph::TestPreset>::operator->(local_3d8);
      pOVar12 = std::optional<cmCMakePresetsGraph::TestPreset::OutputOptions>::operator->
                          (&pTVar8->Output);
      piVar26 = std::optional<int>::operator*(&pOVar12->MaxPassedTestOutputSize);
      cmCTestTestHandler::SetTestOutputSizePassed(&pPVar22->TestHandler,*piVar26);
    }
    pTVar8 = std::optional<cmCMakePresetsGraph::TestPreset>::operator->(local_3d8);
    pOVar12 = std::optional<cmCMakePresetsGraph::TestPreset::OutputOptions>::operator->
                        (&pTVar8->Output);
    bVar6 = std::optional::operator_cast_to_bool((optional *)&pOVar12->MaxFailedTestOutputSize);
    if (bVar6) {
      pPVar22 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                operator->(&this->Impl);
      pTVar8 = std::optional<cmCMakePresetsGraph::TestPreset>::operator->(local_3d8);
      pOVar12 = std::optional<cmCMakePresetsGraph::TestPreset::OutputOptions>::operator->
                          (&pTVar8->Output);
      piVar26 = std::optional<int>::operator*(&pOVar12->MaxFailedTestOutputSize);
      cmCTestTestHandler::SetTestOutputSizeFailed(&pPVar22->TestHandler,*piVar26);
    }
    pTVar8 = std::optional<cmCMakePresetsGraph::TestPreset>::operator->(local_3d8);
    pOVar12 = std::optional<cmCMakePresetsGraph::TestPreset::OutputOptions>::operator->
                        (&pTVar8->Output);
    bVar6 = std::optional::operator_cast_to_bool((optional *)&pOVar12->TestOutputTruncation);
    if (bVar6) {
      pTVar8 = std::optional<cmCMakePresetsGraph::TestPreset>::operator->(local_3d8);
      pOVar12 = std::optional<cmCMakePresetsGraph::TestPreset::OutputOptions>::operator->
                          (&pTVar8->Output);
      pTVar13 = std::optional<cmCTestTypes::TruncationMode>::operator*
                          (&pOVar12->TestOutputTruncation);
      TVar2 = *pTVar13;
      pPVar22 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                operator->(&this->Impl);
      (pPVar22->TestHandler).TestOutputTruncation = TVar2;
    }
    pTVar8 = std::optional<cmCMakePresetsGraph::TestPreset>::operator->(local_3d8);
    pOVar12 = std::optional<cmCMakePresetsGraph::TestPreset::OutputOptions>::operator->
                        (&pTVar8->Output);
    bVar6 = std::optional::operator_cast_to_bool((optional *)&pOVar12->MaxTestNameWidth);
    if (bVar6) {
      pTVar8 = std::optional<cmCMakePresetsGraph::TestPreset>::operator->(local_3d8);
      pOVar12 = std::optional<cmCMakePresetsGraph::TestPreset::OutputOptions>::operator->
                          (&pTVar8->Output);
      piVar26 = std::optional<int>::operator*(&pOVar12->MaxTestNameWidth);
      iVar3 = *piVar26;
      pPVar22 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                operator->(&this->Impl);
      pPVar22->MaxTestNameWidth = iVar3;
    }
  }
  pTVar8 = std::optional<cmCMakePresetsGraph::TestPreset>::operator->(local_3d8);
  bVar6 = std::optional::operator_cast_to_bool((optional *)&pTVar8->Filter);
  if (bVar6) {
    pTVar8 = std::optional<cmCMakePresetsGraph::TestPreset>::operator->(local_3d8);
    pFVar14 = std::optional<cmCMakePresetsGraph::TestPreset::FilterOptions>::operator->
                        (&pTVar8->Filter);
    bVar6 = std::optional::operator_cast_to_bool((optional *)pFVar14);
    if (bVar6) {
      pTVar8 = std::optional<cmCMakePresetsGraph::TestPreset>::operator->(local_3d8);
      pFVar14 = std::optional<cmCMakePresetsGraph::TestPreset::FilterOptions>::operator->
                          (&pTVar8->Filter);
      pIVar15 = std::optional<cmCMakePresetsGraph::TestPreset::IncludeOptions>::operator->
                          (&pFVar14->Include);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_830,"IncludeRegularExpression",&local_831);
      SetPersistentOptionIfNotEmpty(this,&pIVar15->Name,&local_830);
      std::__cxx11::string::~string((string *)&local_830);
      std::allocator<char>::~allocator(&local_831);
      pTVar8 = std::optional<cmCMakePresetsGraph::TestPreset>::operator->(local_3d8);
      pFVar14 = std::optional<cmCMakePresetsGraph::TestPreset::FilterOptions>::operator->
                          (&pTVar8->Filter);
      pIVar15 = std::optional<cmCMakePresetsGraph::TestPreset::IncludeOptions>::operator->
                          (&pFVar14->Include);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_858,"LabelRegularExpression",(allocator<char> *)((long)&start + 7)
                );
      AddPersistentMultiOptionIfNotEmpty(this,&pIVar15->Label,&local_858);
      std::__cxx11::string::~string((string *)&local_858);
      std::allocator<char>::~allocator((allocator<char> *)((long)&start + 7));
      pTVar8 = std::optional<cmCMakePresetsGraph::TestPreset>::operator->(local_3d8);
      pFVar14 = std::optional<cmCMakePresetsGraph::TestPreset::FilterOptions>::operator->
                          (&pTVar8->Filter);
      pIVar15 = std::optional<cmCMakePresetsGraph::TestPreset::IncludeOptions>::operator->
                          (&pFVar14->Include);
      bVar6 = std::optional::operator_cast_to_bool((optional *)&pIVar15->Index);
      if (bVar6) {
        pTVar8 = std::optional<cmCMakePresetsGraph::TestPreset>::operator->(local_3d8);
        pFVar14 = std::optional<cmCMakePresetsGraph::TestPreset::FilterOptions>::operator->
                            (&pTVar8->Filter);
        pIVar15 = std::optional<cmCMakePresetsGraph::TestPreset::IncludeOptions>::operator->
                            (&pFVar14->Include);
        std::optional<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions>::operator->
                  (&pIVar15->Index);
        uVar10 = std::__cxx11::string::empty();
        if ((uVar10 & 1) == 0) {
          pTVar8 = std::optional<cmCMakePresetsGraph::TestPreset>::operator->(local_3d8);
          pFVar14 = std::optional<cmCMakePresetsGraph::TestPreset::FilterOptions>::operator->
                              (&pTVar8->Filter);
          pIVar15 = std::optional<cmCMakePresetsGraph::TestPreset::IncludeOptions>::operator->
                              (&pFVar14->Include);
          pIVar18 = std::optional<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions>::
                    operator->(&pIVar15->Index);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_9e8,"TestsToRunInformation",&local_9e9);
          SetPersistentOptionIfNotEmpty(this,&pIVar18->IndexFile,&local_9e8);
          std::__cxx11::string::~string((string *)&local_9e8);
          std::allocator<char>::~allocator(&local_9e9);
        }
        else {
          pTVar8 = std::optional<cmCMakePresetsGraph::TestPreset>::operator->(local_3d8);
          pFVar14 = std::optional<cmCMakePresetsGraph::TestPreset::FilterOptions>::operator->
                              (&pTVar8->Filter);
          pIVar15 = std::optional<cmCMakePresetsGraph::TestPreset::IncludeOptions>::operator->
                              (&pFVar14->Include);
          pIVar18 = std::optional<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions>::
                    operator->(&pIVar15->Index);
          pTVar8 = std::optional<cmCMakePresetsGraph::TestPreset>::operator->(local_3d8);
          pFVar14 = std::optional<cmCMakePresetsGraph::TestPreset::FilterOptions>::operator->
                              (&pTVar8->Filter);
          pIVar15 = std::optional<cmCMakePresetsGraph::TestPreset::IncludeOptions>::operator->
                              (&pFVar14->Include);
          pIVar16 = std::optional<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions>::
                    operator->(&pIVar15->Index);
          pTVar8 = std::optional<cmCMakePresetsGraph::TestPreset>::operator->(local_3d8);
          pFVar14 = std::optional<cmCMakePresetsGraph::TestPreset::FilterOptions>::operator->
                              (&pTVar8->Filter);
          pIVar15 = std::optional<cmCMakePresetsGraph::TestPreset::IncludeOptions>::operator->
                              (&pFVar14->Include);
          pIVar17 = std::optional<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions>::
                    operator->(&pIVar15->Index);
          indexOptions.field_2._8_8_ = &pIVar17->Stride;
          std::__cxx11::string::string((string *)local_898);
          bVar6 = std::optional::operator_cast_to_bool((optional *)pIVar18);
          local_8da = 0;
          if (bVar6) {
            piVar26 = std::optional<int>::operator*(&pIVar18->Start);
            std::__cxx11::to_string(&local_8d8,*piVar26);
          }
          else {
            std::allocator<char>::allocator();
            local_8da = 1;
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_8d8,"",&local_8d9);
          }
          std::operator+(&local_8b8,&local_8d8,",");
          std::__cxx11::string::operator+=((string *)local_898,(string *)&local_8b8);
          std::__cxx11::string::~string((string *)&local_8b8);
          std::__cxx11::string::~string((string *)&local_8d8);
          if ((local_8da & 1) != 0) {
            std::allocator<char>::~allocator(&local_8d9);
          }
          bVar6 = std::optional::operator_cast_to_bool((optional *)&pIVar16->End);
          local_922 = 0;
          if (bVar6) {
            piVar26 = std::optional<int>::operator*(&pIVar16->End);
            std::__cxx11::to_string(&local_920,*piVar26);
          }
          else {
            std::allocator<char>::allocator();
            local_922 = 1;
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_920,"",&local_921);
          }
          std::operator+(&local_900,&local_920,",");
          std::__cxx11::string::operator+=((string *)local_898,(string *)&local_900);
          std::__cxx11::string::~string((string *)&local_900);
          std::__cxx11::string::~string((string *)&local_920);
          if ((local_922 & 1) != 0) {
            std::allocator<char>::~allocator(&local_921);
          }
          bVar6 = std::optional::operator_cast_to_bool((optional *)indexOptions.field_2._8_8_);
          local_96a = 0;
          if (bVar6) {
            piVar26 = std::optional<int>::operator*((optional<int> *)indexOptions.field_2._8_8_);
            std::__cxx11::to_string(&local_968,*piVar26);
          }
          else {
            std::allocator<char>::allocator();
            local_96a = 1;
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_968,"",&local_969);
          }
          std::operator+(&local_948,&local_968,",");
          std::__cxx11::string::operator+=((string *)local_898,(string *)&local_948);
          std::__cxx11::string::~string((string *)&local_948);
          std::__cxx11::string::~string((string *)&local_968);
          if ((local_96a & 1) != 0) {
            std::allocator<char>::~allocator(&local_969);
          }
          pTVar8 = std::optional<cmCMakePresetsGraph::TestPreset>::operator->(local_3d8);
          pFVar14 = std::optional<cmCMakePresetsGraph::TestPreset::FilterOptions>::operator->
                              (&pTVar8->Filter);
          pIVar15 = std::optional<cmCMakePresetsGraph::TestPreset::IncludeOptions>::operator->
                              (&pFVar14->Include);
          pIVar18 = std::optional<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions>::
                    operator->(&pIVar15->Index);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_9a0,",");
          cmJoin<std::vector<int,std::allocator<int>>>(&local_990,&pIVar18->SpecificTests,local_9a0)
          ;
          std::__cxx11::string::operator+=((string *)local_898,(string *)&local_990);
          std::__cxx11::string::~string((string *)&local_990);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_9c0,"TestsToRunInformation",&local_9c1);
          SetPersistentOptionIfNotEmpty(this,(string *)local_898,&local_9c0);
          std::__cxx11::string::~string((string *)&local_9c0);
          std::allocator<char>::~allocator(&local_9c1);
          std::__cxx11::string::~string((string *)local_898);
        }
      }
      pTVar8 = std::optional<cmCMakePresetsGraph::TestPreset>::operator->(local_3d8);
      pFVar14 = std::optional<cmCMakePresetsGraph::TestPreset::FilterOptions>::operator->
                          (&pTVar8->Filter);
      pIVar15 = std::optional<cmCMakePresetsGraph::TestPreset::IncludeOptions>::operator->
                          (&pFVar14->Include);
      local_9ea = false;
      bVar6 = std::optional<bool>::value_or<bool>(&pIVar15->UseUnion,&local_9ea);
      if (bVar6) {
        this_00 = GetTestHandler(this);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_a10,"UseUnion",&local_a11);
        cmCTestGenericHandler::SetPersistentOption
                  (&this_00->super_cmCTestGenericHandler,&local_a10,"true");
        std::__cxx11::string::~string((string *)&local_a10);
        std::allocator<char>::~allocator(&local_a11);
        this_01 = GetMemCheckHandler(this);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_a38,"UseUnion",&local_a39);
        cmCTestGenericHandler::SetPersistentOption
                  ((cmCTestGenericHandler *)this_01,&local_a38,"true");
        std::__cxx11::string::~string((string *)&local_a38);
        std::allocator<char>::~allocator(&local_a39);
      }
    }
    pTVar8 = std::optional<cmCMakePresetsGraph::TestPreset>::operator->(local_3d8);
    pFVar14 = std::optional<cmCMakePresetsGraph::TestPreset::FilterOptions>::operator->
                        (&pTVar8->Filter);
    bVar6 = std::optional::operator_cast_to_bool((optional *)&pFVar14->Exclude);
    if (bVar6) {
      pTVar8 = std::optional<cmCMakePresetsGraph::TestPreset>::operator->(local_3d8);
      pFVar14 = std::optional<cmCMakePresetsGraph::TestPreset::FilterOptions>::operator->
                          (&pTVar8->Filter);
      pEVar19 = std::optional<cmCMakePresetsGraph::TestPreset::ExcludeOptions>::operator->
                          (&pFVar14->Exclude);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a60,"ExcludeRegularExpression",&local_a61);
      SetPersistentOptionIfNotEmpty(this,&pEVar19->Name,&local_a60);
      std::__cxx11::string::~string((string *)&local_a60);
      std::allocator<char>::~allocator(&local_a61);
      pTVar8 = std::optional<cmCMakePresetsGraph::TestPreset>::operator->(local_3d8);
      pFVar14 = std::optional<cmCMakePresetsGraph::TestPreset::FilterOptions>::operator->
                          (&pTVar8->Filter);
      pEVar19 = std::optional<cmCMakePresetsGraph::TestPreset::ExcludeOptions>::operator->
                          (&pFVar14->Exclude);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a88,"ExcludeLabelRegularExpression",&local_a89);
      AddPersistentMultiOptionIfNotEmpty(this,&pEVar19->Label,&local_a88);
      std::__cxx11::string::~string((string *)&local_a88);
      std::allocator<char>::~allocator(&local_a89);
      pTVar8 = std::optional<cmCMakePresetsGraph::TestPreset>::operator->(local_3d8);
      pFVar14 = std::optional<cmCMakePresetsGraph::TestPreset::FilterOptions>::operator->
                          (&pTVar8->Filter);
      pEVar19 = std::optional<cmCMakePresetsGraph::TestPreset::ExcludeOptions>::operator->
                          (&pFVar14->Exclude);
      bVar6 = std::optional::operator_cast_to_bool((optional *)&pEVar19->Fixtures);
      if (bVar6) {
        pTVar8 = std::optional<cmCMakePresetsGraph::TestPreset>::operator->(local_3d8);
        pFVar14 = std::optional<cmCMakePresetsGraph::TestPreset::FilterOptions>::operator->
                            (&pTVar8->Filter);
        pEVar19 = std::optional<cmCMakePresetsGraph::TestPreset::ExcludeOptions>::operator->
                            (&pFVar14->Exclude);
        pFVar20 = std::optional<cmCMakePresetsGraph::TestPreset::ExcludeOptions::FixturesOptions>::
                  operator->(&pEVar19->Fixtures);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_ab0,"ExcludeFixtureRegularExpression",&local_ab1);
        SetPersistentOptionIfNotEmpty(this,&pFVar20->Any,&local_ab0);
        std::__cxx11::string::~string((string *)&local_ab0);
        std::allocator<char>::~allocator(&local_ab1);
        pTVar8 = std::optional<cmCMakePresetsGraph::TestPreset>::operator->(local_3d8);
        pFVar14 = std::optional<cmCMakePresetsGraph::TestPreset::FilterOptions>::operator->
                            (&pTVar8->Filter);
        pEVar19 = std::optional<cmCMakePresetsGraph::TestPreset::ExcludeOptions>::operator->
                            (&pFVar14->Exclude);
        pFVar20 = std::optional<cmCMakePresetsGraph::TestPreset::ExcludeOptions::FixturesOptions>::
                  operator->(&pEVar19->Fixtures);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_ad8,"ExcludeFixtureSetupRegularExpression",&local_ad9);
        SetPersistentOptionIfNotEmpty(this,&pFVar20->Setup,&local_ad8);
        std::__cxx11::string::~string((string *)&local_ad8);
        std::allocator<char>::~allocator(&local_ad9);
        pTVar8 = std::optional<cmCMakePresetsGraph::TestPreset>::operator->(local_3d8);
        pFVar14 = std::optional<cmCMakePresetsGraph::TestPreset::FilterOptions>::operator->
                            (&pTVar8->Filter);
        pEVar19 = std::optional<cmCMakePresetsGraph::TestPreset::ExcludeOptions>::operator->
                            (&pFVar14->Exclude);
        pFVar20 = std::optional<cmCMakePresetsGraph::TestPreset::ExcludeOptions::FixturesOptions>::
                  operator->(&pEVar19->Fixtures);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&jobs,"ExcludeFixtureCleanupRegularExpression",&local_b01);
        SetPersistentOptionIfNotEmpty(this,&pFVar20->Cleanup,(string *)&jobs);
        std::__cxx11::string::~string((string *)&jobs);
        std::allocator<char>::~allocator(&local_b01);
      }
    }
  }
  pTVar8 = std::optional<cmCMakePresetsGraph::TestPreset>::operator->(local_3d8);
  bVar6 = std::optional::operator_cast_to_bool((optional *)&pTVar8->Execution);
  if (bVar6) {
    pTVar8 = std::optional<cmCMakePresetsGraph::TestPreset>::operator->(local_3d8);
    pEVar21 = std::optional<cmCMakePresetsGraph::TestPreset::ExecutionOptions>::operator->
                        (&pTVar8->Execution);
    local_b02 = false;
    bVar6 = std::optional<bool>::value_or<bool>(&pEVar21->StopOnFailure,&local_b02);
    pPVar22 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                        (&this->Impl);
    pPVar22->StopOnFailure = bVar6;
    pTVar8 = std::optional<cmCMakePresetsGraph::TestPreset>::operator->(local_3d8);
    pEVar21 = std::optional<cmCMakePresetsGraph::TestPreset::ExecutionOptions>::operator->
                        (&pTVar8->Execution);
    local_b03 = false;
    bVar6 = std::optional<bool>::value_or<bool>(&pEVar21->EnableFailover,&local_b03);
    pPVar22 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                        (&this->Impl);
    pPVar22->Failover = bVar6;
    pTVar8 = std::optional<cmCMakePresetsGraph::TestPreset>::operator->(local_3d8);
    pEVar21 = std::optional<cmCMakePresetsGraph::TestPreset::ExecutionOptions>::operator->
                        (&pTVar8->Execution);
    bVar6 = std::optional::operator_cast_to_bool((optional *)&pEVar21->Jobs);
    if (bVar6) {
      pTVar8 = std::optional<cmCMakePresetsGraph::TestPreset>::operator->(local_3d8);
      pEVar21 = std::optional<cmCMakePresetsGraph::TestPreset::ExecutionOptions>::operator->
                          (&pTVar8->Execution);
      piVar26 = std::optional<int>::operator*(&pEVar21->Jobs);
      local_b08 = *piVar26;
      SetParallelLevel(this,local_b08);
      pPVar22 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                operator->(&this->Impl);
      pPVar22->ParallelLevelSetInCli = true;
    }
    pTVar8 = std::optional<cmCMakePresetsGraph::TestPreset>::operator->(local_3d8);
    pEVar21 = std::optional<cmCMakePresetsGraph::TestPreset::ExecutionOptions>::operator->
                        (&pTVar8->Execution);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&testLoad,"ResourceSpecFile",&local_b29);
    SetPersistentOptionIfNotEmpty(this,&pEVar21->ResourceSpecFile,(string *)&testLoad);
    std::__cxx11::string::~string((string *)&testLoad);
    std::allocator<char>::~allocator(&local_b29);
    pTVar8 = std::optional<cmCMakePresetsGraph::TestPreset>::operator->(local_3d8);
    pEVar21 = std::optional<cmCMakePresetsGraph::TestPreset::ExecutionOptions>::operator->
                        (&pTVar8->Execution);
    bVar6 = std::optional::operator_cast_to_bool((optional *)&pEVar21->TestLoad);
    if (bVar6) {
      pTVar8 = std::optional<cmCMakePresetsGraph::TestPreset>::operator->(local_3d8);
      pEVar21 = std::optional<cmCMakePresetsGraph::TestPreset::ExecutionOptions>::operator->
                          (&pTVar8->Execution);
      piVar26 = std::optional<int>::operator*(&pEVar21->TestLoad);
      local_b30 = *piVar26;
      SetTestLoad(this,(long)local_b30);
    }
    pTVar8 = std::optional<cmCMakePresetsGraph::TestPreset>::operator->(local_3d8);
    pEVar21 = std::optional<cmCMakePresetsGraph::TestPreset::ExecutionOptions>::operator->
                        (&pTVar8->Execution);
    bVar6 = std::optional::operator_cast_to_bool((optional *)&pEVar21->ShowOnly);
    if (bVar6) {
      pPVar22 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                operator->(&this->Impl);
      pPVar22->ShowOnly = true;
      pTVar8 = std::optional<cmCMakePresetsGraph::TestPreset>::operator->(local_3d8);
      pEVar21 = std::optional<cmCMakePresetsGraph::TestPreset::ExecutionOptions>::operator->
                          (&pTVar8->Execution);
      pSVar23 = std::optional<cmCMakePresetsGraph::TestPreset::ExecutionOptions::ShowOnlyEnum>::
                operator*(&pEVar21->ShowOnly);
      if ((*pSVar23 != Human) && (*pSVar23 == JsonV1)) {
        pPVar22 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                  operator->(&this->Impl);
        pPVar22->Quiet = true;
        pPVar22 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                  operator->(&this->Impl);
        pPVar22->OutputAsJson = true;
        pPVar22 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                  operator->(&this->Impl);
        pPVar22->OutputAsJsonVersion = 1;
      }
    }
    pTVar8 = std::optional<cmCMakePresetsGraph::TestPreset>::operator->(local_3d8);
    pEVar21 = std::optional<cmCMakePresetsGraph::TestPreset::ExecutionOptions>::operator->
                        (&pTVar8->Execution);
    bVar6 = std::optional::operator_cast_to_bool((optional *)&pEVar21->Repeat);
    if (!bVar6) {
LAB_0096f719:
      pTVar8 = std::optional<cmCMakePresetsGraph::TestPreset>::operator->(local_3d8);
      pEVar21 = std::optional<cmCMakePresetsGraph::TestPreset::ExecutionOptions>::operator->
                          (&pTVar8->Execution);
      bVar6 = std::optional::operator_cast_to_bool((optional *)&pEVar21->InteractiveDebugging);
      if (bVar6) {
        pTVar8 = std::optional<cmCMakePresetsGraph::TestPreset>::operator->(local_3d8);
        pEVar21 = std::optional<cmCMakePresetsGraph::TestPreset::ExecutionOptions>::operator->
                            (&pTVar8->Execution);
        pbVar25 = std::optional<bool>::operator*(&pEVar21->InteractiveDebugging);
        bVar6 = *pbVar25;
        pPVar22 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                  operator->(&this->Impl);
        pPVar22->InteractiveDebugMode = (bool)(bVar6 & 1);
      }
      pTVar8 = std::optional<cmCMakePresetsGraph::TestPreset>::operator->(local_3d8);
      pEVar21 = std::optional<cmCMakePresetsGraph::TestPreset::ExecutionOptions>::operator->
                          (&pTVar8->Execution);
      local_b31 = false;
      bVar6 = std::optional<bool>::value_or<bool>(&pEVar21->ScheduleRandom,&local_b31);
      if (bVar6) {
        pPVar22 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                  operator->(&this->Impl);
        std::__cxx11::string::operator=((string *)&pPVar22->ScheduleType,"Random");
      }
      pTVar8 = std::optional<cmCMakePresetsGraph::TestPreset>::operator->(local_3d8);
      pEVar21 = std::optional<cmCMakePresetsGraph::TestPreset::ExecutionOptions>::operator->
                          (&pTVar8->Execution);
      bVar6 = std::optional::operator_cast_to_bool((optional *)&pEVar21->Timeout);
      if (bVar6) {
        pTVar8 = std::optional<cmCMakePresetsGraph::TestPreset>::operator->(local_3d8);
        pEVar21 = std::optional<cmCMakePresetsGraph::TestPreset::ExecutionOptions>::operator->
                            (&pTVar8->Execution);
        piVar26 = std::optional<int>::operator*(&pEVar21->Timeout);
        std::chrono::duration<double,std::ratio<1l,1l>>::duration<int,void>
                  ((duration<double,std::ratio<1l,1l>> *)&local_b40,piVar26);
        pPVar22 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                  operator->(&this->Impl);
        (pPVar22->GlobalTimeout).__r = local_b40;
      }
      pTVar8 = std::optional<cmCMakePresetsGraph::TestPreset>::operator->(local_3d8);
      pEVar21 = std::optional<cmCMakePresetsGraph::TestPreset::ExecutionOptions>::operator->
                          (&pTVar8->Execution);
      bVar6 = std::optional::operator_cast_to_bool((optional *)&pEVar21->NoTestsAction);
      if (bVar6) {
        pTVar8 = std::optional<cmCMakePresetsGraph::TestPreset>::operator->(local_3d8);
        pEVar21 = std::optional<cmCMakePresetsGraph::TestPreset::ExecutionOptions>::operator->
                            (&pTVar8->Execution);
        pNVar27 = std::
                  optional<cmCMakePresetsGraph::TestPreset::ExecutionOptions::NoTestsActionEnum>::
                  operator*(&pEVar21->NoTestsAction);
        NVar5 = *pNVar27;
        if (NVar5 != Default) {
          if (NVar5 == Error) {
            pPVar22 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                      operator->(&this->Impl);
            pPVar22->NoTestsMode = Error;
          }
          else {
            if (NVar5 != Ignore) {
              this_local._7_1_ = false;
              goto LAB_0096f94e;
            }
            pPVar22 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                      operator->(&this->Impl);
            pPVar22->NoTestsMode = Ignore;
          }
        }
      }
      goto LAB_0096f940;
    }
    pTVar8 = std::optional<cmCMakePresetsGraph::TestPreset>::operator->(local_3d8);
    pEVar21 = std::optional<cmCMakePresetsGraph::TestPreset::ExecutionOptions>::operator->
                        (&pTVar8->Execution);
    pRVar24 = std::optional<cmCMakePresetsGraph::TestPreset::ExecutionOptions::RepeatOptions>::
              operator->(&pEVar21->Repeat);
    iVar3 = pRVar24->Count;
    pPVar22 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                        (&this->Impl);
    pPVar22->RepeatCount = iVar3;
    pTVar8 = std::optional<cmCMakePresetsGraph::TestPreset>::operator->(local_3d8);
    pEVar21 = std::optional<cmCMakePresetsGraph::TestPreset::ExecutionOptions>::operator->
                        (&pTVar8->Execution);
    pRVar24 = std::optional<cmCMakePresetsGraph::TestPreset::ExecutionOptions::RepeatOptions>::
              operator->(&pEVar21->Repeat);
    MVar4 = pRVar24->Mode;
    if (MVar4 == UntilFail) {
      pPVar22 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                operator->(&this->Impl);
      pPVar22->RepeatMode = UntilFail;
      goto LAB_0096f719;
    }
    if (MVar4 == UntilPass) {
      pPVar22 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                operator->(&this->Impl);
      pPVar22->RepeatMode = UntilPass;
      goto LAB_0096f719;
    }
    if (MVar4 == AfterTimeout) {
      pPVar22 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                operator->(&this->Impl);
      pPVar22->RepeatMode = AfterTimeout;
      goto LAB_0096f719;
    }
    this_local._7_1_ = false;
  }
  else {
LAB_0096f940:
    this_local._7_1_ = true;
  }
LAB_0096f94e:
  presetPair._M_node._4_4_ = 1;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          *)&__range1);
LAB_0096f96a:
  cmCMakePresetsGraph::~cmCMakePresetsGraph((cmCMakePresetsGraph *)local_208);
  std::__cxx11::string::~string
            ((string *)
             &settingsFile.Files.
              super__Vector_base<std::unique_ptr<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return this_local._7_1_;
}

Assistant:

bool cmCTest::SetArgsFromPreset(const std::string& presetName,
                                bool listPresets)
{
  const auto workingDirectory = cmSystemTools::GetCurrentWorkingDirectory();

  cmCMakePresetsGraph settingsFile;
  auto result = settingsFile.ReadProjectPresets(workingDirectory);
  if (result != cmCMakePresetsGraph::ReadFileResult::READ_OK) {
    cmSystemTools::Error(
      cmStrCat("Could not read presets from ", workingDirectory, ": ",
               cmCMakePresetsGraph::ResultToString(result)));
    return false;
  }

  if (listPresets) {
    settingsFile.PrintTestPresetList();
    return true;
  }

  auto presetPair = settingsFile.TestPresets.find(presetName);
  if (presetPair == settingsFile.TestPresets.end()) {
    cmSystemTools::Error(cmStrCat("No such test preset in ", workingDirectory,
                                  ": \"", presetName, '"'));
    settingsFile.PrintTestPresetList();
    return false;
  }

  if (presetPair->second.Unexpanded.Hidden) {
    cmSystemTools::Error(cmStrCat("Cannot use hidden test preset in ",
                                  workingDirectory, ": \"", presetName, '"'));
    settingsFile.PrintTestPresetList();
    return false;
  }

  auto const& expandedPreset = presetPair->second.Expanded;
  if (!expandedPreset) {
    cmSystemTools::Error(cmStrCat("Could not evaluate test preset \"",
                                  presetName, "\": Invalid macro expansion"));
    settingsFile.PrintTestPresetList();
    return false;
  }

  if (!expandedPreset->ConditionResult) {
    cmSystemTools::Error(cmStrCat("Cannot use disabled test preset in ",
                                  workingDirectory, ": \"", presetName, '"'));
    settingsFile.PrintTestPresetList();
    return false;
  }

  auto configurePresetPair =
    settingsFile.ConfigurePresets.find(expandedPreset->ConfigurePreset);
  if (configurePresetPair == settingsFile.ConfigurePresets.end()) {
    cmSystemTools::Error(cmStrCat("No such configure preset in ",
                                  workingDirectory, ": \"",
                                  expandedPreset->ConfigurePreset, '"'));
    settingsFile.PrintConfigurePresetList();
    return false;
  }

  if (configurePresetPair->second.Unexpanded.Hidden) {
    cmSystemTools::Error(cmStrCat("Cannot use hidden configure preset in ",
                                  workingDirectory, ": \"",
                                  expandedPreset->ConfigurePreset, '"'));
    settingsFile.PrintConfigurePresetList();
    return false;
  }

  auto const& expandedConfigurePreset = configurePresetPair->second.Expanded;
  if (!expandedConfigurePreset) {
    cmSystemTools::Error(cmStrCat("Could not evaluate configure preset \"",
                                  expandedPreset->ConfigurePreset,
                                  "\": Invalid macro expansion"));
    return false;
  }

  auto presetEnvironment = expandedPreset->Environment;
  for (auto const& var : presetEnvironment) {
    if (var.second) {
      cmSystemTools::PutEnv(cmStrCat(var.first, '=', *var.second));
    }
  }

  if (!expandedPreset->Configuration.empty()) {
    this->SetConfigType(expandedPreset->Configuration);
  }

  // Set build directory to value specified by the configure preset.
  this->AddCTestConfigurationOverwrite(
    cmStrCat("BuildDirectory=", expandedConfigurePreset->BinaryDir));
  for (const auto& kvp : expandedPreset->OverwriteConfigurationFile) {
    this->AddCTestConfigurationOverwrite(kvp);
  }

  if (expandedPreset->Output) {
    this->Impl->TestProgressOutput =
      expandedPreset->Output->ShortProgress.value_or(false);

    if (expandedPreset->Output->Verbosity) {
      const auto& verbosity = *expandedPreset->Output->Verbosity;
      switch (verbosity) {
        case cmCMakePresetsGraph::TestPreset::OutputOptions::VerbosityEnum::
          Extra:
          this->Impl->ExtraVerbose = true;
          CM_FALLTHROUGH;
        case cmCMakePresetsGraph::TestPreset::OutputOptions::VerbosityEnum::
          Verbose:
          this->Impl->Verbose = true;
          break;
        case cmCMakePresetsGraph::TestPreset::OutputOptions::VerbosityEnum::
          Default:
        default:
          // leave default settings
          break;
      }
    }

    this->Impl->Debug = expandedPreset->Output->Debug.value_or(false);
    this->Impl->ShowLineNumbers =
      expandedPreset->Output->Debug.value_or(false);
    this->Impl->OutputTestOutputOnTestFailure =
      expandedPreset->Output->OutputOnFailure.value_or(false);
    this->Impl->Quiet = expandedPreset->Output->Quiet.value_or(false);

    if (!expandedPreset->Output->OutputLogFile.empty()) {
      this->SetOutputLogFileName(expandedPreset->Output->OutputLogFile);
    }
    if (!expandedPreset->Output->OutputJUnitFile.empty()) {
      this->SetOutputJUnitFileName(expandedPreset->Output->OutputJUnitFile);
    }

    this->Impl->LabelSummary =
      expandedPreset->Output->LabelSummary.value_or(true);
    this->Impl->SubprojectSummary =
      expandedPreset->Output->SubprojectSummary.value_or(true);

    if (expandedPreset->Output->MaxPassedTestOutputSize) {
      this->Impl->TestHandler.SetTestOutputSizePassed(
        *expandedPreset->Output->MaxPassedTestOutputSize);
    }

    if (expandedPreset->Output->MaxFailedTestOutputSize) {
      this->Impl->TestHandler.SetTestOutputSizeFailed(
        *expandedPreset->Output->MaxFailedTestOutputSize);
    }

    if (expandedPreset->Output->TestOutputTruncation) {
      this->Impl->TestHandler.TestOutputTruncation =
        *expandedPreset->Output->TestOutputTruncation;
    }

    if (expandedPreset->Output->MaxTestNameWidth) {
      this->Impl->MaxTestNameWidth = *expandedPreset->Output->MaxTestNameWidth;
    }
  }

  if (expandedPreset->Filter) {
    if (expandedPreset->Filter->Include) {
      this->SetPersistentOptionIfNotEmpty(
        expandedPreset->Filter->Include->Name, "IncludeRegularExpression");
      this->AddPersistentMultiOptionIfNotEmpty(
        expandedPreset->Filter->Include->Label, "LabelRegularExpression");

      if (expandedPreset->Filter->Include->Index) {
        if (expandedPreset->Filter->Include->Index->IndexFile.empty()) {
          const auto& start = expandedPreset->Filter->Include->Index->Start;
          const auto& end = expandedPreset->Filter->Include->Index->End;
          const auto& stride = expandedPreset->Filter->Include->Index->Stride;
          std::string indexOptions;
          indexOptions += (start ? std::to_string(*start) : "") + ",";
          indexOptions += (end ? std::to_string(*end) : "") + ",";
          indexOptions += (stride ? std::to_string(*stride) : "") + ",";
          indexOptions +=
            cmJoin(expandedPreset->Filter->Include->Index->SpecificTests, ",");

          this->SetPersistentOptionIfNotEmpty(indexOptions,
                                              "TestsToRunInformation");
        } else {
          this->SetPersistentOptionIfNotEmpty(
            expandedPreset->Filter->Include->Index->IndexFile,
            "TestsToRunInformation");
        }
      }

      if (expandedPreset->Filter->Include->UseUnion.value_or(false)) {
        this->GetTestHandler()->SetPersistentOption("UseUnion", "true");
        this->GetMemCheckHandler()->SetPersistentOption("UseUnion", "true");
      }
    }

    if (expandedPreset->Filter->Exclude) {
      this->SetPersistentOptionIfNotEmpty(
        expandedPreset->Filter->Exclude->Name, "ExcludeRegularExpression");
      this->AddPersistentMultiOptionIfNotEmpty(
        expandedPreset->Filter->Exclude->Label,
        "ExcludeLabelRegularExpression");

      if (expandedPreset->Filter->Exclude->Fixtures) {
        this->SetPersistentOptionIfNotEmpty(
          expandedPreset->Filter->Exclude->Fixtures->Any,
          "ExcludeFixtureRegularExpression");
        this->SetPersistentOptionIfNotEmpty(
          expandedPreset->Filter->Exclude->Fixtures->Setup,
          "ExcludeFixtureSetupRegularExpression");
        this->SetPersistentOptionIfNotEmpty(
          expandedPreset->Filter->Exclude->Fixtures->Cleanup,
          "ExcludeFixtureCleanupRegularExpression");
      }
    }
  }

  if (expandedPreset->Execution) {
    this->Impl->StopOnFailure =
      expandedPreset->Execution->StopOnFailure.value_or(false);
    this->Impl->Failover =
      expandedPreset->Execution->EnableFailover.value_or(false);

    if (expandedPreset->Execution->Jobs) {
      auto jobs = *expandedPreset->Execution->Jobs;
      this->SetParallelLevel(jobs);
      this->Impl->ParallelLevelSetInCli = true;
    }

    this->SetPersistentOptionIfNotEmpty(
      expandedPreset->Execution->ResourceSpecFile, "ResourceSpecFile");

    if (expandedPreset->Execution->TestLoad) {
      auto testLoad = *expandedPreset->Execution->TestLoad;
      this->SetTestLoad(testLoad);
    }

    if (expandedPreset->Execution->ShowOnly) {
      this->Impl->ShowOnly = true;

      switch (*expandedPreset->Execution->ShowOnly) {
        case cmCMakePresetsGraph::TestPreset::ExecutionOptions::ShowOnlyEnum::
          JsonV1:
          this->Impl->Quiet = true;
          this->Impl->OutputAsJson = true;
          this->Impl->OutputAsJsonVersion = 1;
          break;
        case cmCMakePresetsGraph::TestPreset::ExecutionOptions::ShowOnlyEnum::
          Human:
          // intentional fallthrough (human is the default)
        default:
          break;
      }
    }

    if (expandedPreset->Execution->Repeat) {
      this->Impl->RepeatCount = expandedPreset->Execution->Repeat->Count;
      switch (expandedPreset->Execution->Repeat->Mode) {
        case cmCMakePresetsGraph::TestPreset::ExecutionOptions::RepeatOptions::
          ModeEnum::UntilFail:
          this->Impl->RepeatMode = cmCTest::Repeat::UntilFail;
          break;
        case cmCMakePresetsGraph::TestPreset::ExecutionOptions::RepeatOptions::
          ModeEnum::UntilPass:
          this->Impl->RepeatMode = cmCTest::Repeat::UntilPass;
          break;
        case cmCMakePresetsGraph::TestPreset::ExecutionOptions::RepeatOptions::
          ModeEnum::AfterTimeout:
          this->Impl->RepeatMode = cmCTest::Repeat::AfterTimeout;
          break;
        default:
          // should never default since mode is required
          return false;
      }
    }

    if (expandedPreset->Execution->InteractiveDebugging) {
      this->Impl->InteractiveDebugMode =
        *expandedPreset->Execution->InteractiveDebugging;
    }

    if (expandedPreset->Execution->ScheduleRandom.value_or(false)) {
      this->Impl->ScheduleType = "Random";
    }

    if (expandedPreset->Execution->Timeout) {
      this->Impl->GlobalTimeout =
        cmDuration(*expandedPreset->Execution->Timeout);
    }

    if (expandedPreset->Execution->NoTestsAction) {
      switch (*expandedPreset->Execution->NoTestsAction) {
        case cmCMakePresetsGraph::TestPreset::ExecutionOptions::
          NoTestsActionEnum::Error:
          this->Impl->NoTestsMode = cmCTest::NoTests::Error;
          break;
        case cmCMakePresetsGraph::TestPreset::ExecutionOptions::
          NoTestsActionEnum::Ignore:
          this->Impl->NoTestsMode = cmCTest::NoTests::Ignore;
          break;
        case cmCMakePresetsGraph::TestPreset::ExecutionOptions::
          NoTestsActionEnum::Default:
          break;
        default:
          // should never default
          return false;
      }
    }
  }

  return true;
}